

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

Index __thiscall
BayesianGameWithClusterInfo::FindTypeClusterIndex
          (BayesianGameWithClusterInfo *this,Index agI,TypeCluster *tc_previous,Index aI,Index oI)

{
  Type *this_00;
  bool bVar1;
  SubClass SVar2;
  Index IVar3;
  const_reference ppvVar4;
  reference ppTVar5;
  reference ppTVar6;
  TypeCluster *pTVar7;
  undefined8 uVar8;
  Index in_ECX;
  TypeCluster *in_RDX;
  Index in_R8D;
  Type_PointerTuple *t;
  Type *t1;
  type_ci last2;
  type_ci it2;
  TypeCluster *tc;
  bool finished;
  Index foundtcI;
  Index tcI;
  typeC_ci last;
  typeC_ci it;
  TypeClusterList *tcl;
  TypeCluster *in_stack_ffffffffffffff48;
  Index in_stack_ffffffffffffff50;
  Index in_stack_ffffffffffffff54;
  TypeCluster *in_stack_ffffffffffffff58;
  Type_PointerTuple *local_a0;
  byte local_8e;
  byte local_8d;
  char *in_stack_ffffffffffffff78;
  __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
  in_stack_ffffffffffffff80;
  _Self local_60;
  _Self local_58;
  TypeCluster *local_50;
  byte local_41;
  Index local_40;
  Index local_3c;
  TypeCluster **local_38;
  __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
  local_30;
  value_type local_28;
  Index local_20;
  Index local_1c;
  TypeCluster *local_18;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  ppvVar4 = std::
            vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            ::at((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                  *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (size_type)in_stack_ffffffffffffff48);
  local_28 = *ppvVar4;
  local_30._M_current =
       (TypeCluster **)
       std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::begin
                 ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)in_stack_ffffffffffffff48
                 );
  local_38 = (TypeCluster **)
             std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::end
                       ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
                        in_stack_ffffffffffffff48);
  local_3c = 0;
  local_40 = 0x2a;
  local_41 = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (__normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                        *)in_stack_ffffffffffffff48);
    local_8d = 0;
    if (bVar1) {
      local_8d = local_41 ^ 0xff;
    }
    if ((local_8d & 1) == 0) break;
    ppTVar5 = __gnu_cxx::
              __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
              ::operator*(&local_30);
    local_50 = *ppTVar5;
    local_58._M_node = (_Base_ptr)TypeCluster::begin(in_stack_ffffffffffffff48);
    local_60._M_node = (_Base_ptr)TypeCluster::end(in_stack_ffffffffffffff48);
    while( true ) {
      bVar1 = std::operator!=(&local_58,&local_60);
      local_8e = 0;
      if (bVar1) {
        local_8e = local_41 ^ 0xff;
      }
      if ((local_8e & 1) == 0) break;
      ppTVar6 = std::_Rb_tree_const_iterator<Type_*>::operator*
                          ((_Rb_tree_const_iterator<Type_*> *)0x8c0b81);
      this_00 = *ppTVar6;
      SVar2 = Type::GetSubClass(this_00);
      if (SVar2 == POINTERTUPLE) {
        if (this_00 == (Type *)0x0) {
          local_a0 = (Type_PointerTuple *)0x0;
        }
        else {
          local_a0 = (Type_PointerTuple *)
                     __dynamic_cast(this_00,&Type::typeinfo,&Type_PointerTuple::typeinfo,0);
        }
        in_stack_ffffffffffffff58 = local_18;
        pTVar7 = Type_PointerTuple::GetPredecessor(local_a0);
        if (((in_stack_ffffffffffffff58 == pTVar7) &&
            (in_stack_ffffffffffffff54 = local_1c, IVar3 = Type_PointerTuple::GetAction(local_a0),
            in_stack_ffffffffffffff54 == IVar3)) &&
           (in_stack_ffffffffffffff50 = local_20,
           IVar3 = Type_PointerTuple::GetObservation(local_a0), in_stack_ffffffffffffff50 == IVar3))
        {
          local_41 = 1;
          local_40 = local_3c;
        }
      }
      std::_Rb_tree_const_iterator<Type_*>::operator++
                ((_Rb_tree_const_iterator<Type_*> *)in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff54);
    }
    local_3c = local_3c + 1;
    in_stack_ffffffffffffff80 =
         __gnu_cxx::
         __normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
         ::operator++((__normal_iterator<TypeCluster_*const_*,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                       *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  }
  if ((local_41 & 1) != 0) {
    return local_40;
  }
  uVar8 = __cxa_allocate_exception(0x28);
  E::E((E *)in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff78);
  __cxa_throw(uVar8,&E::typeinfo,E::~E);
}

Assistant:

Index 
BayesianGameWithClusterInfo::FindTypeClusterIndex(
        Index agI, const TypeCluster* tc_previous, 
    Index aI, Index oI) const
{
    const TypeClusterList* tcl = _m_typeLists.at(agI);
    typeC_ci it = tcl->begin();
    typeC_ci last = tcl->end();

    Index tcI = 0; 
    Index foundtcI = 42;
    bool finished = false;
    while(it != last && !finished)
    {
        const TypeCluster* tc = *it;
        TypeCluster::type_ci it2 = tc->begin();
        TypeCluster::type_ci last2 = tc->end();
        while(it2 != last2  && !finished )
        {
            const Type* t1 = *it2;
            if(t1->GetSubClass() == Type::POINTERTUPLE)
            {
                const Type_PointerTuple* t = dynamic_cast
                    <const Type_PointerTuple*>(t1);
                if( tc_previous == t->GetPredecessor() &&
                    aI == t->GetAction() &&
                    oI == t->GetObservation() )
                {
                    finished = true;
                    foundtcI = tcI;
                }
            }
            it2++;
        }
        tcI++;
        it++;
    }
    if(!finished)
        throw E("BayesianGameWithClusterInfo::FindTypeClusterIndex - no matching type found!");

    return(foundtcI);
}